

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * E2toC(Clifford *__return_storage_ptr__,float x,float y)

{
  pointer *ppBVar1;
  iterator iVar2;
  Blade local_28;
  double local_20;
  float local_14;
  
  local_20 = (double)CONCAT44(local_20._4_4_,y);
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14 = x;
  Blade::Blade(&local_28,1,x);
  std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
            (__return_storage_ptr__,(iterator)0x0,&local_28);
  Blade::~Blade(&local_28);
  Blade::Blade(&local_28,2,local_20._0_4_);
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
              (__return_storage_ptr__,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  Blade::~Blade(&local_28);
  local_20 = (double)(local_14 * local_14 + local_20._0_4_ * local_20._0_4_);
  Blade::Blade(&local_28,8,(float)((local_20 + -1.0) * 0.5));
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
              (__return_storage_ptr__,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  Blade::~Blade(&local_28);
  Blade::Blade(&local_28,0x10,(float)((local_20 + 1.0) * 0.5));
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
              (__return_storage_ptr__,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  Blade::~Blade(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Clifford E2toC(float x, float y)
{
	//e1.insert(e1.begin(),Blade(1,x));
	//e2.insert(e2.begin(),Blade(2,y));
	Clifford R;
	R.push_back(Blade(1,x));
	R.push_back(Blade(2,y));
	float d=(x*x+y*y);
	R.push_back(Blade(8,(d-1.0)/2.0));
	R.push_back(Blade(16,(d+1.0)/2.0));
	return R;
}